

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetVertexBuffers
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Uint32 StartSlot,
          Uint32 NumBuffersSet,IBuffer **ppBuffers,Uint64 *pOffsets,
          RESOURCE_STATE_TRANSITION_MODE StateTransitionMode,SET_VERTEX_BUFFERS_FLAGS Flags)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  BufferVkImpl *pBVar3;
  Uint64 UVar4;
  uint uVar5;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  undefined7 in_register_00000089;
  char (*Args_3) [8];
  uint uVar6;
  VertexStreamInfo<Diligent::BufferVkImpl> *pVVar7;
  Uint32 s;
  ulong uVar8;
  undefined4 uStack_88;
  Uint32 StartSlot_local;
  Uint32 local_80;
  uint local_7c;
  string msg;
  String local_50;
  
  Args_3 = (char (*) [8])CONCAT71(in_register_00000089,StateTransitionMode);
  Type = (COMMAND_QUEUE_TYPE)NumBuffersSet;
  CVar2 = (this->m_Desc).QueueType;
  StartSlot_local = StartSlot;
  local_80 = NumBuffersSet;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&msg,(char (*) [79])
                      "Queue type may never be unknown for immediate contexts. This looks like a bug."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetVertexBuffers",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x2d2);
      std::__cxx11::string::~string((string *)&msg);
    }
    FormatString<char[97]>
              (&msg,(char (*) [97])
                    "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d2);
    std::__cxx11::string::~string((string *)&msg);
    CVar2 = (this->m_Desc).QueueType;
    Type = extraout_DL;
  }
  if ((~CVar2 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_50,(Diligent *)(ulong)CVar2,Type);
    FormatString<char[17],char[22],std::__cxx11::string,char[8]>
              (&msg,(Diligent *)"SetVertexBuffers",(char (*) [17])0x7e8bba,(char (*) [22])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",Args_3
              );
    std::__cxx11::string::~string((string *)&local_50);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d2);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (0x1f < StartSlot_local) {
    local_50._M_dataplus._M_p._0_4_ = 0x1f;
    FormatString<char[26],unsigned_int,char[30],unsigned_int,char[3]>
              (&msg,(Diligent *)"Start vertex buffer slot ",(char (*) [26])&StartSlot_local,
               (uint *)0x70c3ff,(char (*) [30])&local_50,(uint *)0x6f9544,
               (char (*) [3])CONCAT44(StartSlot_local,uStack_88));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d4);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (0x20 < StartSlot_local + local_80) {
    local_50._M_dataplus._M_p._0_4_ = (StartSlot_local + local_80) - 1;
    local_7c._0_1_ = '\x1f';
    local_7c._1_1_ = '\0';
    local_7c._2_1_ = '\0';
    local_7c._3_1_ = '\0';
    FormatString<char[45],unsigned_int,char[3],unsigned_int,char[32],unsigned_int,char[3]>
              (&msg,(Diligent *)"The range of vertex buffer slots being set [",
               (char (*) [45])&StartSlot_local,(uint *)0x800c44,(char (*) [3])&local_50,
               (uint *)"] is out of allowed range  [0, ",(char (*) [32])&local_7c,(uint *)0x6f9544,
               (char (*) [3])CONCAT44(StartSlot_local,uStack_88));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d8);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) &&
     ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0)) {
    FormatString<char[188]>
              (&msg,(char (*) [188])
                    "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2dc);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((Flags & SET_VERTEX_BUFFERS_FLAG_RESET) == SET_VERTEX_BUFFERS_FLAG_NONE) {
    uVar6 = this->m_NumVertexStreams;
  }
  else {
    pVVar7 = this->m_VertexStreams;
    for (uVar8 = 0; uVar8 < StartSlot_local; uVar8 = uVar8 + 1) {
      msg._M_dataplus._M_p = (pointer)0x0;
      msg._M_string_length = 0;
      VertexStreamInfo<Diligent::BufferVkImpl>::operator=
                (pVVar7,(VertexStreamInfo<Diligent::BufferVkImpl> *)&msg);
      RefCntAutoPtr<Diligent::BufferVkImpl>::Release((RefCntAutoPtr<Diligent::BufferVkImpl> *)&msg);
      pVVar7 = pVVar7 + 1;
    }
    uVar8 = (ulong)(StartSlot_local + local_80);
    pVVar7 = this->m_VertexStreams + uVar8;
    for (; uVar8 < this->m_NumVertexStreams; uVar8 = uVar8 + 1) {
      msg._M_dataplus._M_p = (pointer)0x0;
      msg._M_string_length = 0;
      VertexStreamInfo<Diligent::BufferVkImpl>::operator=
                (pVVar7,(VertexStreamInfo<Diligent::BufferVkImpl> *)&msg);
      RefCntAutoPtr<Diligent::BufferVkImpl>::Release((RefCntAutoPtr<Diligent::BufferVkImpl> *)&msg);
      pVVar7 = pVVar7 + 1;
    }
    this->m_NumVertexStreams = 0;
    uVar6 = 0;
  }
  uVar5 = StartSlot_local + local_80;
  if (StartSlot_local + local_80 < uVar6) {
    uVar5 = uVar6;
  }
  this->m_NumVertexStreams = uVar5;
  for (local_7c = 0; local_7c < local_80; local_7c = local_7c + 1) {
    uVar6 = StartSlot_local + local_7c;
    if (ppBuffers == (IBuffer **)0x0) {
      pBVar3 = (BufferVkImpl *)0x0;
    }
    else {
      pBVar3 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(ppBuffers[local_7c]);
    }
    pVVar7 = this->m_VertexStreams + uVar6;
    RefCntAutoPtr<Diligent::BufferVkImpl>::operator=(&pVVar7->pBuffer,pBVar3);
    if (pOffsets == (Uint64 *)0x0) {
      UVar4 = 0;
    }
    else {
      UVar4 = pOffsets[local_7c];
    }
    pVVar7->Offset = UVar4;
    pBVar3 = (pVVar7->pBuffer).m_pObject;
    if ((pBVar3 != (BufferVkImpl *)0x0) &&
       (((pBVar3->super_BufferBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
         .m_Desc.BindFlags & BIND_VERTEX_BUFFER) == BIND_NONE)) {
      local_50._M_dataplus._M_p =
           (pBVar3->super_BufferBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           .m_Desc.super_DeviceObjectAttribs.Name;
      if (local_50._M_dataplus._M_p == (char *)0x0) {
        local_50._M_dataplus._M_p = "";
      }
      FormatString<char[9],char_const*,char[40],unsigned_int,char[46]>
                (&msg,(Diligent *)0x6f3938,(char (*) [9])&local_50,
                 (char **)"\' being bound as vertex buffer to slot ",(char (*) [40])&local_7c,
                 (uint *)" was not created with BIND_VERTEX_BUFFER flag",
                 (char (*) [46])CONCAT44(StartSlot_local,uStack_88));
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"SetVertexBuffers",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x2f6);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  while( true ) {
    uVar6 = this->m_NumVertexStreams;
    if (((ulong)uVar6 == 0) ||
       (this->m_VertexStreams[uVar6 - 1].pBuffer.m_pObject != (BufferVkImpl *)0x0)) break;
    msg._M_dataplus._M_p = (pointer)0x0;
    msg._M_string_length = 0;
    this->m_NumVertexStreams = uVar6 - 1;
    VertexStreamInfo<Diligent::BufferVkImpl>::operator=
              (this->m_VertexStreams + uVar6,(VertexStreamInfo<Diligent::BufferVkImpl> *)&msg);
    RefCntAutoPtr<Diligent::BufferVkImpl>::Release((RefCntAutoPtr<Diligent::BufferVkImpl> *)&msg);
  }
  pUVar1 = &(this->m_Stats).CommandCounters.SetVertexBuffers;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::SetVertexBuffers(
    Uint32                         StartSlot,
    Uint32                         NumBuffersSet,
    IBuffer* const*                ppBuffers,
    const Uint64*                  pOffsets,
    RESOURCE_STATE_TRANSITION_MODE StateTransitionMode,
    SET_VERTEX_BUFFERS_FLAGS       Flags)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetVertexBuffers");

    DEV_CHECK_ERR(StartSlot < MAX_BUFFER_SLOTS, "Start vertex buffer slot ", StartSlot, " is out of allowed range [0, ", MAX_BUFFER_SLOTS - 1, "].");

    DEV_CHECK_ERR(StartSlot + NumBuffersSet <= MAX_BUFFER_SLOTS,
                  "The range of vertex buffer slots being set [", StartSlot, ", ", StartSlot + NumBuffersSet - 1,
                  "] is out of allowed range  [0, ", MAX_BUFFER_SLOTS - 1, "].");

    DEV_CHECK_ERR(!(m_pActiveRenderPass != nullptr && StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION),
                  "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. "
                  "Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first.");

    if (Flags & SET_VERTEX_BUFFERS_FLAG_RESET)
    {
        // Reset only these buffer slots that are not being set.
        // It is very important to not reset buffers that stay unchanged
        // as AddRef()/Release() are not free
        for (Uint32 s = 0; s < StartSlot; ++s)
            m_VertexStreams[s] = VertexStreamInfo<BufferImplType>{};
        for (Uint32 s = StartSlot + NumBuffersSet; s < m_NumVertexStreams; ++s)
            m_VertexStreams[s] = VertexStreamInfo<BufferImplType>{};
        m_NumVertexStreams = 0;
    }
    m_NumVertexStreams = (std::max)(m_NumVertexStreams, StartSlot + NumBuffersSet);

    for (Uint32 Buff = 0; Buff < NumBuffersSet; ++Buff)
    {
        VertexStreamInfo<BufferImplType>& CurrStream{m_VertexStreams[StartSlot + Buff]};
        CurrStream.pBuffer = ppBuffers ? ClassPtrCast<BufferImplType>(ppBuffers[Buff]) : nullptr;
        CurrStream.Offset  = pOffsets ? pOffsets[Buff] : 0;
#ifdef DILIGENT_DEVELOPMENT
        if (CurrStream.pBuffer)
        {
            const BufferDesc& BuffDesc = CurrStream.pBuffer->GetDesc();
            DEV_CHECK_ERR((BuffDesc.BindFlags & BIND_VERTEX_BUFFER) != 0,
                          "Buffer '", BuffDesc.Name ? BuffDesc.Name : "", "' being bound as vertex buffer to slot ", Buff,
                          " was not created with BIND_VERTEX_BUFFER flag");
        }
#endif
    }
    // Remove null buffers from the end of the array
    while (m_NumVertexStreams > 0 && !m_VertexStreams[m_NumVertexStreams - 1].pBuffer)
        m_VertexStreams[m_NumVertexStreams--] = VertexStreamInfo<BufferImplType>{};

    ++m_Stats.CommandCounters.SetVertexBuffers;
}